

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QStringView,QXmlStreamReaderPrivate::Entity>::emplace<QXmlStreamReaderPrivate::Entity_const&>
          (QHash<QStringView,QXmlStreamReaderPrivate::Entity> *this,QStringView *key,Entity *args)

{
  QArrayData *pQVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *pDVar3;
  long in_FS_OFFSET;
  piter pVar4;
  Entity local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QArrayData **)this;
  if (pQVar1 == (QArrayData *)0x0) {
LAB_003a8ed8:
    pDVar3 = *(Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> **)this;
    local_58.name.d.d = (Data *)pQVar1;
    if ((pDVar3 == (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)0x0)
       || (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar3 = QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>
               ::detached(pDVar3);
      *(Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> **)this = pDVar3;
    }
    pVar4 = (piter)emplace_helper<QXmlStreamReaderPrivate::Entity_const&>(this,key,args);
    QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash
              ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)&local_58);
  }
  else {
    if (1 < (uint)(pQVar1->ref_)._q_value.super___atomic_base<int>._M_i) {
      if ((pQVar1 != (QArrayData *)0x0) &&
         ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_003a8ed8;
    }
    uVar2._0_4_ = pQVar1[1].ref_;
    uVar2._4_4_ = pQVar1[1].flags;
    if ((ulong)pQVar1->alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar4 = (piter)emplace_helper<QXmlStreamReaderPrivate::Entity_const&>(this,key,args);
        return (iterator)pVar4;
      }
      goto LAB_003a9017;
    }
    local_58.name.d.d = (args->name).d.d;
    local_58.name.d.ptr = (args->name).d.ptr;
    local_58.name.d.size = (args->name).d.size;
    if (&(local_58.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.value.d.d = (args->value).d.d;
    local_58.value.d.ptr = (args->value).d.ptr;
    local_58.value.d.size = (args->value).d.size;
    if (&(local_58.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58._48_1_ = args->field_0x30;
    pVar4 = (piter)QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::
                   emplace_helper<QXmlStreamReaderPrivate::Entity>
                             ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)this,key,
                              &local_58);
    if (&(local_58.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_003a9017:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }